

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::renameRedefinedComponents
          (TraverseSchema *this,DOMElement *redefineElem,SchemaInfo *redefiningSchemaInfo,
          SchemaInfo *redefinedSchemaInfo)

{
  XMLBuffer *this_00;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_01;
  XMLStringPool *pXVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  DOMNode *node;
  undefined4 extraout_var;
  XMLCh *chars;
  undefined4 extraout_var_00;
  XMLCh *str1;
  
  node = &XUtil::getFirstChildElement(&redefineElem->super_DOMNode)->super_DOMNode;
  this_00 = &this->fBuffer;
  for (; node != (DOMNode *)0x0; node = &XUtil::getNextSiblingElement(node)->super_DOMNode) {
    iVar3 = (*node->_vptr_DOMNode[0x18])(node);
    str1 = (XMLCh *)CONCAT44(extraout_var,iVar3);
    bVar2 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (!bVar2) {
      chars = getElementAttValue(this,(DOMElement *)node,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
      XMLBuffer::set(this_00,this->fTargetNSURIString);
      XMLBuffer::append(this_00,L',');
      XMLBuffer::append(this_00,chars);
      this_01 = this->fRedefineComponents;
      pXVar1 = this->fStringPool;
      (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
      iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])();
      bVar2 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                        (this_01,str1,iVar3);
      if (!bVar2) {
        pXVar1 = this->fStringPool;
        uVar4 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,str1);
        iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar4);
        bVar2 = validateRedefineNameChange
                          (this,(DOMElement *)node,(XMLCh *)CONCAT44(extraout_var_00,iVar3),chars,1,
                           redefiningSchemaInfo);
        if (bVar2) {
          fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo,
                             (XMLCh *)CONCAT44(extraout_var_00,iVar3),chars,1);
        }
        else {
          SchemaInfo::addFailedRedefine(redefiningSchemaInfo,(DOMElement *)node);
        }
      }
    }
  }
  return;
}

Assistant:

void TraverseSchema::renameRedefinedComponents(const DOMElement* const redefineElem,
                                               SchemaInfo* const redefiningSchemaInfo,
                                               SchemaInfo* const redefinedSchemaInfo) {

    DOMElement* child = XUtil::getFirstChildElement(redefineElem);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* childName = child->getLocalName();

        if (XMLString::equals(childName, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }

        // if component already redefined skip
        const XMLCh* typeName = getElementAttValue(child, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

        fBuffer.set(fTargetNSURIString);
        fBuffer.append(chComma);
        fBuffer.append(typeName);

        if (fRedefineComponents->containsKey(childName, fStringPool->addOrFind(fBuffer.getRawBuffer()))) {
            continue;
        }

        // Rename
        const XMLCh* tmpChildName = fStringPool->getValueForId(fStringPool->addOrFind(childName));

        if (validateRedefineNameChange(child, tmpChildName, typeName, 1, redefiningSchemaInfo)) {
            fixRedefinedSchema(child, redefinedSchemaInfo, tmpChildName, typeName, 1);
        }
        else {
            redefiningSchemaInfo->addFailedRedefine(child);
        }
    }
}